

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

wchar_t archive_acl_from_text_w(archive_acl *acl,wchar_t *text,wchar_t want_type)

{
  int *piVar1;
  uint *puVar2;
  wchar_t wVar3;
  int iVar4;
  wchar_t wVar5;
  wchar_t *pwVar6;
  long lVar7;
  int *piVar8;
  byte bVar9;
  uint uVar10;
  undefined4 uVar11;
  ulong uVar12;
  uint *puVar13;
  ulong uVar14;
  byte bVar15;
  wchar_t wVar16;
  uint *puVar17;
  int iVar18;
  int iVar19;
  undefined4 uVar20;
  ulong uVar21;
  ulong uVar22;
  wchar_t *pwVar23;
  wchar_t *end;
  undefined8 uVar24;
  uint uVar25;
  wchar_t wVar26;
  bool bVar27;
  anon_struct_16_2_267fbce2 field [6];
  wchar_t local_f4;
  wchar_t *local_f0;
  wchar_t *local_e8;
  ulong local_e0;
  undefined8 local_d8;
  ulong local_d0;
  wchar_t local_c8;
  wchar_t local_c4;
  ulong local_c0;
  uint local_b8;
  uint local_b4;
  archive_acl *local_b0;
  ulong local_a8;
  long local_a0;
  wchar_t *local_98;
  long local_90;
  wchar_t *local_88 [5];
  long alStack_60 [6];
  
  local_b8 = 5;
  if (want_type < L'̀') {
    if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
      return L'\xffffffe2';
    }
  }
  else if (want_type == L'㰀') {
    local_b8 = 6;
  }
  else {
    if (want_type != L'̀') {
      return L'\xffffffe2';
    }
    want_type = L'Ā';
  }
  wVar26 = L'\0';
  local_b0 = acl;
  if (text == (wchar_t *)0x0) {
    local_c8 = L'\0';
  }
  else {
    local_c8 = L'\0';
    local_c4 = want_type;
    if (*text != L'\0') {
      uVar14 = (ulong)local_b8;
      local_a0 = uVar14 + 0xfffffffe;
      uVar22 = 0;
      local_c8 = L'\0';
      local_c0 = uVar14;
LAB_0028bc3b:
      uVar21 = 0;
      do {
        while ((uVar12 = uVar21, (ulong)(uint)*text < 0x21 &&
               ((0x100000600U >> ((ulong)(uint)*text & 0x3f) & 1) != 0))) {
          text = text + 1;
          uVar21 = uVar12;
        }
        uVar21 = 0;
        while( true ) {
          uVar25 = *(uint *)((long)text + uVar21);
          if (((ulong)uVar25 < 0x3b) && ((0x400100800000401U >> ((ulong)uVar25 & 0x3f) & 1) != 0))
          break;
          uVar21 = uVar21 + 4;
        }
        puVar13 = (uint *)((long)text + uVar21);
        puVar17 = puVar13;
        for (puVar2 = puVar13; (uVar21 != 0 && (puVar17 = puVar2, (ulong)puVar2[-1] < 0x21));
            puVar2 = puVar2 + -1) {
          uVar21 = 0x100000600U >> ((ulong)puVar2[-1] & 0x3f) & 1;
        }
        if (uVar25 == 0x23) {
          while( true ) {
            uVar25 = *puVar13;
            if (((ulong)uVar25 < 0x2d) && ((0x100000000401U >> ((ulong)uVar25 & 0x3f) & 1) != 0))
            break;
            puVar13 = puVar13 + 1;
          }
        }
        uVar10 = *puVar13;
        if (uVar12 < uVar14) {
          (&local_98)[uVar12 * 2] = text;
          (&local_90)[uVar12 * 2] = (long)puVar17;
        }
        text = (wchar_t *)(puVar13 + (uVar10 != 0));
        uVar21 = uVar12 + 1;
      } while (uVar25 == 0x3a);
      uVar25 = (uint)uVar12;
      local_a8 = uVar22;
      if ((uint)(uVar12 + 1) < local_b8) {
        memset(local_88 + uVar12 * 2,0,(ulong)((int)local_a0 - uVar25) * 0x10 + 0x10);
      }
      pwVar23 = local_98;
      if ((local_98 != (wchar_t *)0x0) && (*local_98 == L'#')) {
        uVar22 = local_a8 & 0xffffffff;
        uVar14 = local_c0;
        goto LAB_0028c65e;
      }
      local_f4 = L'\0';
      if (local_c4 != L'㰀') {
        if ((*local_98 == L'd') &&
           ((uVar14 = local_90 - (long)local_98 >> 2, local_90 - (long)local_98 == 4 ||
            ((6 < uVar14 &&
             (local_d0 = uVar14, iVar4 = wmemcmp(local_98 + 1,anon_var_dwarf_1f15ed,6),
             uVar14 = local_d0, iVar4 == 0)))))) {
          uVar24 = 0;
          local_e0 = CONCAT44(local_e0._4_4_,0x200);
          if (uVar14 < 8) {
            uVar24 = 1;
          }
          else {
            local_98 = pwVar23 + 7;
          }
        }
        else {
          uVar24 = 0;
          local_e0 = CONCAT44(local_e0._4_4_,local_c4);
        }
        iVar4 = (int)uVar24;
        local_b4 = iVar4 + 1;
        pwVar23 = *(wchar_t **)((long)&local_98 + (ulong)(local_b4 * 0x10));
        end = *(wchar_t **)((long)&local_90 + (ulong)(local_b4 * 0x10));
        if (pwVar23 < end) {
          wVar26 = L'\0';
          pwVar6 = pwVar23;
          do {
            wVar5 = *pwVar6;
            if ((uint)(wVar5 + L'\xffffffc6') < 0xfffffff6) goto LAB_0028be6e;
            wVar3 = L'\x7fffffff';
            if ((wVar26 < L'\x0ccccccd') && ((wVar26 != L'\x0ccccccc' || (wVar5 < L'8')))) {
              wVar3 = wVar5 + wVar26 * 10 + L'\xffffffd0';
            }
            wVar26 = wVar3;
            pwVar6 = pwVar6 + 1;
          } while (pwVar6 < end);
        }
        else {
LAB_0028be6e:
          wVar26 = L'\xffffffff';
        }
        wVar5 = wVar26;
        if ((wVar26 == L'\xffffffff') && (iVar4 + 3U <= uVar25)) {
          uVar14 = (ulong)((iVar4 + 3U) * 0x10);
          piVar8 = *(int **)((long)&local_98 + uVar14);
          piVar1 = *(int **)((long)&local_90 + uVar14);
          if (piVar8 < piVar1) {
            wVar3 = L'\0';
            do {
              iVar19 = *piVar8;
              wVar5 = wVar26;
              if (iVar19 - 0x3aU < 0xfffffff6) break;
              wVar5 = L'\x7fffffff';
              if ((wVar3 < L'\x0ccccccd') && ((wVar3 != L'\x0ccccccc' || (iVar19 < 0x38)))) {
                wVar5 = iVar19 + wVar3 * 10 + L'\xffffffd0';
              }
              piVar8 = piVar8 + 1;
              wVar3 = wVar5;
            } while (piVar8 < piVar1);
          }
        }
        piVar8 = *(int **)((long)&local_98 + (ulong)(uint)(iVar4 << 4));
        uVar10 = *piVar8 - 0x67U >> 1 | (uint)((*piVar8 - 0x67U & 1) != 0) << 0x1f;
        iVar18 = 0;
        local_d0 = CONCAT44(local_d0._4_4_,0x2713);
        iVar19 = 0;
        if (uVar10 < 8) {
          lVar7 = *(long *)((long)&local_90 + (ulong)(uint)(iVar4 << 4)) - (long)piVar8;
          pwVar6 = piVar8 + 1;
          iVar19 = 0;
          switch(uVar10) {
          case 0:
            if ((lVar7 == 4) ||
               ((iVar19 = iVar18, lVar7 == 0x14 &&
                (local_f0 = pwVar23, local_e8 = end, local_d8 = uVar24,
                iVar4 = wmemcmp(pwVar6,anon_var_dwarf_3d6e6 + 2,4), pwVar23 = local_f0,
                end = local_e8, uVar24 = local_d8, iVar4 == 0)))) {
              iVar19 = 0x2714;
            }
            break;
          case 3:
            if ((lVar7 == 4) ||
               ((iVar19 = iVar18, lVar7 == 0x10 &&
                (local_f0 = pwVar23, local_e8 = end, local_d8 = uVar24,
                iVar4 = wmemcmp(pwVar6,anon_var_dwarf_1f178d + 1,3), pwVar23 = local_f0,
                end = local_e8, uVar24 = local_d8, iVar4 == 0)))) {
              iVar19 = 0x2715;
            }
            break;
          case 4:
            if ((lVar7 == 4) ||
               ((iVar19 = iVar18, lVar7 == 0x14 &&
                (local_f0 = pwVar23, local_e8 = end, local_d8 = uVar24,
                iVar4 = wmemcmp(pwVar6,anon_var_dwarf_1f1798 + 1,4), pwVar23 = local_f0,
                end = local_e8, uVar24 = local_d8, iVar4 == 0)))) {
              iVar19 = 0x2716;
            }
            break;
          case 7:
            if ((lVar7 == 4) ||
               ((iVar19 = iVar18, lVar7 == 0x10 &&
                (local_f0 = pwVar23, local_e8 = end, local_d8 = uVar24,
                iVar4 = wmemcmp(pwVar6,anon_var_dwarf_3dbe8 + 2,3), pwVar23 = local_f0,
                end = local_e8, uVar24 = local_d8, iVar4 == 0)))) {
              local_d0 = CONCAT44(local_d0._4_4_,0x2711);
              iVar19 = 0x2712;
            }
          }
        }
        if (1 < iVar19 - 0x2715U) {
          if ((iVar19 == 0x2712) || (iVar19 == 0x2714)) {
            iVar4 = 0;
            if ((end <= pwVar23) && (wVar5 == L'\xffffffff')) goto LAB_0028c1f3;
            goto LAB_0028c1f7;
          }
          goto LAB_0028c5c2;
        }
        if ((local_b4 == uVar25 && pwVar23 < end) &&
           (local_f0 = pwVar23, local_e8 = end, local_d8 = uVar24,
           wVar26 = ismode_w(pwVar23,end,&local_f4), pwVar23 = local_f0, end = local_e8,
           uVar24 = local_d8, wVar26 != L'\0')) {
          iVar4 = -1;
LAB_0028c1f3:
          end = (wchar_t *)0x0;
          pwVar23 = (wchar_t *)0x0;
          local_d0 = CONCAT44(local_d0._4_4_,iVar19);
LAB_0028c1f7:
          iVar18 = (int)uVar24;
        }
        else {
          iVar18 = (int)uVar24;
          if (iVar18 + 2U != uVar25) {
            iVar4 = 0;
            goto LAB_0028c1f3;
          }
          if (pwVar23 < end) goto LAB_0028c5c2;
          end = (wchar_t *)0x0;
          pwVar23 = (wchar_t *)0x0;
          iVar4 = 0;
          local_d0 = CONCAT44(local_d0._4_4_,iVar19);
        }
        wVar26 = (wchar_t)local_e0;
        if (local_f4 == L'\0') {
          uVar14 = (ulong)(iVar4 + iVar18 + 2);
          wVar3 = ismode_w((&local_98)[uVar14 * 2],(wchar_t *)(&local_90)[uVar14 * 2],&local_f4);
          wVar26 = (wchar_t)local_e0;
          if (wVar3 == L'\0') goto LAB_0028c5c2;
        }
        goto LAB_0028c622;
      }
      bVar9 = 0;
      bVar27 = true;
      switch(local_90 - (long)local_98 >> 2) {
      case 4:
        iVar4 = wmemcmp(local_98,anon_var_dwarf_3dbe8 + 1,4);
        bVar9 = 0;
        bVar15 = 0;
        uVar20 = 0;
        if (iVar4 == 0) {
          uVar11 = 1;
          bVar27 = false;
          uVar20 = 0x2711;
          goto LAB_0028c25f;
        }
        break;
      case 5:
        iVar4 = wmemcmp(local_98,anon_var_dwarf_3d6e6 + 1,5);
        bVar9 = 0;
        bVar15 = 0;
        uVar20 = 0;
        if (iVar4 == 0) {
          uVar20 = 0x2713;
          bVar15 = 1;
          bVar27 = false;
          bVar9 = 0;
        }
        break;
      case 6:
        iVar4 = wmemcmp(local_98,anon_var_dwarf_1f166a,6);
        bVar27 = false;
        if (iVar4 == 0) {
          uVar11 = 0;
          uVar20 = 0x2712;
        }
        else {
          iVar4 = wmemcmp(pwVar23,anon_var_dwarf_1f1675,6);
          bVar27 = iVar4 != 0;
          uVar20 = 0x2714;
          if (bVar27) {
            uVar20 = 0;
          }
          uVar11 = 0;
        }
        goto LAB_0028c25f;
      default:
        bVar15 = 0;
        uVar20 = 0;
        break;
      case 9:
        iVar4 = wmemcmp(local_98,anon_var_dwarf_1f1680,9);
        uVar11 = 0;
        bVar27 = iVar4 != 0;
        uVar20 = 0x277b;
        if (bVar27) {
          uVar20 = uVar11;
        }
LAB_0028c25f:
        bVar9 = (byte)uVar11;
        bVar15 = 0;
      }
      uVar22 = 0xffffffec;
      uVar14 = local_c0;
      if (!bVar27) {
        local_d0 = CONCAT44(local_d0._4_4_,uVar20);
        wVar26 = L'\xffffffff';
        wVar3 = wVar26;
        if ((bVar9 | bVar15) == 1) {
          iVar4 = 1;
          pwVar23 = local_88[0];
          end = local_88[1];
          if (local_88[0] < local_88[1]) {
            wVar5 = L'\0';
            pwVar6 = local_88[0];
            do {
              wVar16 = *pwVar6;
              wVar3 = wVar26;
              if ((uint)(wVar16 + L'\xffffffc6') < 0xfffffff6) break;
              wVar3 = L'\x7fffffff';
              if ((wVar5 < L'\x0ccccccd') && ((wVar5 != L'\x0ccccccc' || (wVar16 < L'8')))) {
                wVar3 = wVar16 + wVar5 * 10 + L'\xffffffd0';
              }
              wVar5 = wVar3;
              pwVar6 = pwVar6 + 1;
              wVar3 = wVar5;
            } while (pwVar6 < local_88[1]);
          }
        }
        else {
          iVar4 = 0;
          pwVar23 = (wchar_t *)0x0;
          end = (wchar_t *)0x0;
        }
        uVar14 = (ulong)(uint)(iVar4 << 4);
        for (piVar8 = *(int **)((long)local_88 + uVar14);
            piVar8 < *(int **)((long)local_88 + uVar14 + 8); piVar8 = piVar8 + 1) {
          iVar4 = *piVar8;
          if (iVar4 < 99) {
            if (iVar4 < 0x44) {
              if (iVar4 != 0x2d) {
                if (iVar4 == 0x41) {
                  local_f4 = local_f4 | 0x400;
                }
                else {
                  if (iVar4 != 0x43) goto switchD_0028c345_caseD_71;
                  local_f4 = local_f4 | 0x2000;
                }
              }
            }
            else if (iVar4 < 0x57) {
              if (iVar4 == 0x44) {
                local_f4 = local_f4 | 0x100;
              }
              else {
                if (iVar4 != 0x52) goto switchD_0028c345_caseD_71;
                local_f4 = local_f4 | 0x40;
              }
            }
            else if (iVar4 == 0x57) {
              local_f4 = local_f4 | 0x80;
            }
            else {
              if (iVar4 != 0x61) goto switchD_0028c345_caseD_71;
              local_f4 = local_f4 | 0x200;
            }
          }
          else {
            switch(iVar4) {
            case 0x6f:
              local_f4 = local_f4 | 0x4000;
              break;
            case 0x70:
              local_f4 = local_f4 | 0x20;
              break;
            case 0x71:
            case 0x74:
            case 0x75:
            case 0x76:
              goto switchD_0028c345_caseD_71;
            case 0x72:
              local_f4 = local_f4 | 8;
              break;
            case 0x73:
              local_f4 = local_f4 | 0x8000;
              break;
            case 0x77:
              local_f4 = local_f4 | 0x10;
              break;
            case 0x78:
              local_f4 = local_f4 | 1;
              break;
            default:
              if (iVar4 == 99) {
                local_f4 = local_f4 | 0x1000;
              }
              else {
                if (iVar4 != 100) goto switchD_0028c345_caseD_71;
                local_f4 = local_f4 | 0x800;
              }
            }
          }
        }
        for (piVar8 = *(int **)((long)local_88 + uVar14 + 0x10);
            piVar8 < *(int **)((long)local_88 + uVar14 + 0x18); piVar8 = piVar8 + 1) {
          iVar4 = *piVar8;
          if (iVar4 < 100) {
            if (iVar4 < 0x49) {
              if (iVar4 != 0x2d) {
                if (iVar4 != 0x46) goto switchD_0028c345_caseD_71;
                local_f4 = local_f4 | 0x40000000;
              }
            }
            else if (iVar4 == 0x49) {
              local_f4 = local_f4 | 0x1000000;
            }
            else {
              if (iVar4 != 0x53) goto switchD_0028c345_caseD_71;
              local_f4 = local_f4 | 0x20000000;
            }
          }
          else if (iVar4 < 0x69) {
            if (iVar4 == 100) {
              local_f4 = local_f4 | 0x4000000;
            }
            else {
              if (iVar4 != 0x66) goto switchD_0028c345_caseD_71;
              local_f4 = local_f4 | 0x2000000;
            }
          }
          else if (iVar4 == 0x69) {
            local_f4 = local_f4 | 0x10000000;
          }
          else {
            if (iVar4 != 0x6e) goto switchD_0028c345_caseD_71;
            local_f4 = local_f4 | 0x8000000;
          }
        }
        pwVar6 = *(wchar_t **)((long)local_88 + uVar14 + 0x20);
        lVar7 = *(long *)((long)alStack_60 + uVar14) - (long)pwVar6;
        local_e0 = uVar14;
        if (lVar7 == 0x14) {
          local_f0 = pwVar23;
          local_e8 = end;
          iVar4 = wmemcmp(pwVar6,anon_var_dwarf_1f16a2,5);
          if (iVar4 == 0) {
            bVar27 = false;
            wVar26 = L'Ѐ';
            pwVar23 = local_f0;
            end = local_e8;
          }
          else {
            iVar4 = wmemcmp(pwVar6,anon_var_dwarf_1f16ad,5);
            if (iVar4 == 0) {
              bVar27 = false;
              wVar26 = L'က';
              pwVar23 = local_f0;
              end = local_e8;
            }
            else {
              iVar4 = wmemcmp(pwVar6,anon_var_dwarf_1f16b8,5);
              bVar27 = iVar4 != 0;
              wVar26 = (uint)(iVar4 == 0) << 0xd;
              pwVar23 = local_f0;
              end = local_e8;
            }
          }
        }
        else if (lVar7 == 0x10) {
          iVar4 = wmemcmp(pwVar6,anon_var_dwarf_1f1697,4);
          bVar27 = iVar4 != 0;
          wVar26 = (uint)(iVar4 == 0) << 0xb;
        }
        else {
          wVar26 = L'\0';
          bVar27 = true;
        }
        if (!bVar27) {
          piVar8 = *(int **)((long)alStack_60 + local_e0 + 8);
          piVar1 = *(int **)((long)alStack_60 + local_e0 + 0x10);
          wVar5 = wVar3;
          if (piVar8 < piVar1) {
            wVar16 = L'\0';
            do {
              iVar4 = *piVar8;
              wVar5 = wVar3;
              if (iVar4 - 0x3aU < 0xfffffff6) break;
              wVar5 = L'\x7fffffff';
              if ((wVar16 < L'\x0ccccccd') && ((wVar16 != L'\x0ccccccc' || (iVar4 < 0x38)))) {
                wVar5 = iVar4 + wVar16 * 10 + L'\xffffffd0';
              }
              wVar16 = wVar5;
              piVar8 = piVar8 + 1;
              wVar5 = wVar16;
            } while (piVar8 < piVar1);
          }
LAB_0028c622:
          uVar14 = local_c0;
          wVar5 = archive_acl_add_entry_w_len
                            (local_b0,wVar26,local_f4,(wchar_t)local_d0,wVar5,pwVar23,
                             (long)end - (long)pwVar23 >> 2);
          if (wVar5 < L'\xffffffec') {
            return wVar5;
          }
          uVar22 = local_a8 & 0xffffffff;
          if (wVar5 != L'\0') {
            uVar22 = 0xffffffec;
          }
          local_c8 = local_c8 | wVar26;
          goto LAB_0028c65e;
        }
        goto LAB_0028c5c2;
      }
      goto LAB_0028c65e;
    }
  }
LAB_0028c675:
  archive_acl_reset(local_b0,local_c8);
  return wVar26;
switchD_0028c345_caseD_71:
LAB_0028c5c2:
  uVar22 = 0xffffffec;
  uVar14 = local_c0;
LAB_0028c65e:
  wVar26 = (wchar_t)uVar22;
  if (*text == L'\0') goto LAB_0028c675;
  goto LAB_0028bc3b;
}

Assistant:

int
archive_acl_from_text_w(struct archive_acl *acl, const wchar_t *text,
    int want_type)
{
	struct {
		const wchar_t *start;
		const wchar_t *end;
	} field[6], name;

	const wchar_t *s, *st;

	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	wchar_t sep;

	ret = ARCHIVE_OK;
	types = 0;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	while (text != NULL && *text != L'\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const wchar_t *start, *end;
			next_field_w(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == L':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == L'#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == L'd' && (len == 1 || (len >= 7
			    && wmemcmp((s + 1), L"efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint_w(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > n+3)
				isint_w(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			switch (*s) {
			case L'u':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case L'g':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case L'o':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case L'm':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode_w(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 2
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode_w(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (wmemcmp(s, L"user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (wmemcmp(s, L"group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (wmemcmp(s, L"owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (wmemcmp(s, L"group@", len) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (wmemcmp(s, L"everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint_w(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms_w(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags_w(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (wmemcmp(s, L"deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (wmemcmp(s, L"allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (wmemcmp(s, L"audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (wmemcmp(s, L"alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint_w(field[4 + n].start, field[4 + n].end, &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_w_len(acl, type, permset,
		    tag, id, name.start, name.end - name.start);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}